

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O1

void sort_rec2(int *array,int size)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  
  uVar4 = (ulong)(uint)size;
  while (iVar6 = (int)uVar4, 0xf < iVar6) {
    iVar1 = array[uVar4 >> 1];
    lVar11 = -1;
    while( true ) {
      lVar11 = (long)(int)lVar11;
      piVar12 = array + lVar11;
      do {
        lVar11 = lVar11 + 1;
        iVar2 = piVar12[1];
        piVar12 = piVar12 + 1;
      } while (iVar2 < iVar1);
      uVar4 = (ulong)(int)uVar4;
      do {
        lVar3 = uVar4 - 1;
        uVar4 = uVar4 - 1;
      } while (iVar1 < array[lVar3]);
      if ((long)uVar4 <= lVar11) break;
      *piVar12 = array[lVar3];
      array[uVar4] = iVar2;
    }
    sort_rec2(array,(int)lVar11);
    array = piVar12;
    uVar4 = (ulong)(uint)(iVar6 - (int)lVar11);
  }
  if (1 < iVar6) {
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar10 = uVar7 & 0xffffffff;
      uVar8 = uVar5;
      do {
        uVar9 = (uint)uVar8;
        if (array[(int)(uint)uVar10] <= array[uVar8]) {
          uVar9 = (uint)uVar10;
        }
        uVar8 = uVar8 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar4 != uVar8);
      iVar1 = array[uVar7];
      array[uVar7] = array[(int)uVar9];
      uVar7 = uVar7 + 1;
      array[(int)uVar9] = iVar1;
      uVar5 = uVar5 + 1;
    } while (uVar7 != iVar6 - 1);
  }
  return;
}

Assistant:

static void sort_rec2(int* array, int size)
{
    if (size <= 15)
        selectionsort2(array, size);
    else{
        int    pivot = array[size/2];
        int    tmp;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(array[i] < pivot);
            do j--; while(pivot < array[j]);
            if (i >= j) break;
            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        sort_rec2(array    , i     );
        sort_rec2(&array[i], size-i);
    }
}